

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O0

bool __thiscall
cmUVProcessChain::InternalData::Prepare(InternalData *this,cmUVProcessChainBuilder *builder)

{
  StdioType SVar1;
  ulong uVar2;
  int iVar3;
  uv_loop_t *puVar4;
  const_reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  type pPVar8;
  uv_pipe_s *puVar9;
  uv_file local_a0;
  uv_file local_9c;
  int pipeFd_2 [2];
  ProcessData *prevProcess;
  ProcessData *process;
  unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
  local_78;
  ulong local_70;
  size_t i;
  int local_60;
  undefined4 uStack_5c;
  bool first;
  int pipeFd_1 [2];
  StreamData *outputData;
  value_type *output;
  int pipeFd [2];
  StreamData *errorData;
  value_type *error;
  StreamData *inputData;
  value_type *input;
  cmUVProcessChainBuilder *builder_local;
  InternalData *this_local;
  
  this->Builder = builder;
  if (this->Builder->Loop == (uv_loop_t *)0x0) {
    ::cm::uv_loop_ptr::init(&this->BuiltinLoop,(EVP_PKEY_CTX *)0x0);
    puVar4 = ::cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&this->BuiltinLoop);
    this->Loop = puVar4;
  }
  else {
    this->Loop = this->Builder->Loop;
  }
  pvVar5 = std::array<cmUVProcessChainBuilder::StdioConfiguration,_3UL>::operator[]
                     (&this->Builder->Stdio,0);
  SVar1 = pvVar5->Type;
  if (SVar1 == None) {
    (this->InputStreamData).Stdio.flags = UV_IGNORE;
  }
  else if ((SVar1 != Builtin) && (SVar1 == External)) {
    (this->InputStreamData).Stdio.flags = UV_INHERIT_FD;
    (this->InputStreamData).Stdio.data.fd = pvVar5->FileDescriptor;
  }
  pvVar5 = std::array<cmUVProcessChainBuilder::StdioConfiguration,_3UL>::operator[]
                     (&this->Builder->Stdio,2);
  pipeFd = (int  [2])&this->ErrorStreamData;
  SVar1 = pvVar5->Type;
  if (SVar1 == None) {
    (this->ErrorStreamData).Stdio.flags = UV_IGNORE;
  }
  else if (SVar1 == Builtin) {
    iVar3 = cmGetPipes((int *)&output);
    if (iVar3 < 0) {
      return false;
    }
    *(undefined4 *)pipeFd = output._0_4_;
    *(undefined4 *)((long)pipeFd + 8) = 2;
    *(undefined4 *)((long)pipeFd + 0x10) = output._4_4_;
    iVar3 = ::cm::uv_pipe_ptr::init(&this->TempErrorPipe,(EVP_PKEY_CTX *)this->Loop);
    if (iVar3 < 0) {
      return false;
    }
    puVar9 = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                       ((uv_handle_ptr_ *)&this->TempErrorPipe);
    iVar3 = uv_pipe_open(puVar9,*(uv_file *)((long)pipeFd + 0x10));
    if (iVar3 < 0) {
      return false;
    }
  }
  else if (SVar1 == External) {
    (this->ErrorStreamData).Stdio.flags = UV_INHERIT_FD;
    (this->ErrorStreamData).Stdio.data.fd = pvVar5->FileDescriptor;
  }
  pvVar5 = std::array<cmUVProcessChainBuilder::StdioConfiguration,_3UL>::operator[]
                     (&this->Builder->Stdio,1);
  pipeFd_1 = (int  [2])&this->OutputStreamData;
  SVar1 = pvVar5->Type;
  if (SVar1 == None) {
    (this->OutputStreamData).Stdio.flags = UV_IGNORE;
  }
  else if (SVar1 == Builtin) {
    if ((this->Builder->MergedBuiltinStreams & 1U) == 0) {
      iVar3 = cmGetPipes(&local_60);
      if (iVar3 < 0) {
        return false;
      }
      *(int *)pipeFd_1 = local_60;
      *(undefined4 *)((long)pipeFd_1 + 8) = 2;
      *(undefined4 *)((long)pipeFd_1 + 0x10) = uStack_5c;
      iVar3 = ::cm::uv_pipe_ptr::init(&this->TempOutputPipe,(EVP_PKEY_CTX *)this->Loop);
      if (iVar3 < 0) {
        return false;
      }
      puVar9 = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                         ((uv_handle_ptr_ *)&this->TempOutputPipe);
      iVar3 = uv_pipe_open(puVar9,*(uv_file *)((long)pipeFd_1 + 0x10));
      if (iVar3 < 0) {
        return false;
      }
    }
    else {
      ((StreamData *)pipeFd_1)->BuiltinStream = *(int *)pipeFd;
      (this->OutputStreamData).Stdio.flags = UV_INHERIT_FD;
      (this->OutputStreamData).Stdio.data.fd = *(int *)((long)pipeFd + 0x10);
    }
  }
  else if (SVar1 == External) {
    (this->OutputStreamData).Stdio.flags = UV_INHERIT_FD;
    (this->OutputStreamData).Stdio.data.fd = pvVar5->FileDescriptor;
  }
  i._7_1_ = 1;
  local_70 = 0;
  do {
    uVar2 = local_70;
    sVar6 = std::
            vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
            ::size(&this->Builder->Processes);
    if (sVar6 <= uVar2) {
      return true;
    }
    std::make_unique<cmUVProcessChain::InternalData::ProcessData>();
    std::
    vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>,std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>>>
    ::
    emplace_back<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>>
              ((vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>,std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>>>
                *)&this->Processes,&local_78);
    std::
    unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
    ::~unique_ptr(&local_78);
    pvVar7 = std::
             vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
             ::back(&this->Processes);
    pPVar8 = std::
             unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
             ::operator*(pvVar7);
    pPVar8->Data = this;
    (pPVar8->ProcessStatus).Finished = false;
    if ((i._7_1_ & 1) == 0) {
      pvVar7 = std::
               vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
               ::operator[](&this->Processes,local_70 - 1);
      pipeFd_2 = (int  [2])
                 std::
                 unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
                 ::operator*(pvVar7);
      iVar3 = cmGetPipes(&local_a0);
      if (iVar3 < 0) {
        return false;
      }
      iVar3 = ::cm::uv_pipe_ptr::init
                        ((uv_pipe_ptr *)((long)pipeFd_2 + 0x28),(EVP_PKEY_CTX *)this->Loop);
      if (iVar3 < 0) {
        return false;
      }
      puVar9 = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                         ((uv_handle_ptr_ *)((long)pipeFd_2 + 0x28));
      iVar3 = uv_pipe_open(puVar9,local_9c);
      if (iVar3 < 0) {
        return false;
      }
      iVar3 = ::cm::uv_pipe_ptr::init(&pPVar8->InputPipe,(EVP_PKEY_CTX *)this->Loop);
      if (iVar3 < 0) {
        return false;
      }
      puVar9 = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                         ((uv_handle_ptr_ *)&pPVar8->InputPipe);
      iVar3 = uv_pipe_open(puVar9,local_a0);
      if (iVar3 < 0) {
        return false;
      }
    }
    i._7_1_ = 0;
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

bool cmUVProcessChain::InternalData::Prepare(
  const cmUVProcessChainBuilder* builder)
{
  this->Builder = builder;

  if (this->Builder->Loop) {
    this->Loop = this->Builder->Loop;
  } else {
    this->BuiltinLoop.init();
    this->Loop = this->BuiltinLoop;
  }

  auto const& input =
    this->Builder->Stdio[cmUVProcessChainBuilder::Stream_INPUT];
  auto& inputData = this->InputStreamData;
  switch (input.Type) {
    case cmUVProcessChainBuilder::None:
      inputData.Stdio.flags = UV_IGNORE;
      break;

    case cmUVProcessChainBuilder::Builtin: {
      // FIXME
      break;
    }

    case cmUVProcessChainBuilder::External:
      inputData.Stdio.flags = UV_INHERIT_FD;
      inputData.Stdio.data.fd = input.FileDescriptor;
      break;
  }

  auto const& error =
    this->Builder->Stdio[cmUVProcessChainBuilder::Stream_ERROR];
  auto& errorData = this->ErrorStreamData;
  switch (error.Type) {
    case cmUVProcessChainBuilder::None:
      errorData.Stdio.flags = UV_IGNORE;
      break;

    case cmUVProcessChainBuilder::Builtin: {
      int pipeFd[2];
      if (cmGetPipes(pipeFd) < 0) {
        return false;
      }

      errorData.BuiltinStream = pipeFd[0];
      errorData.Stdio.flags = UV_INHERIT_FD;
      errorData.Stdio.data.fd = pipeFd[1];

      if (this->TempErrorPipe.init(*this->Loop, 0) < 0) {
        return false;
      }
      if (uv_pipe_open(this->TempErrorPipe, errorData.Stdio.data.fd) < 0) {
        return false;
      }

      break;
    }

    case cmUVProcessChainBuilder::External:
      errorData.Stdio.flags = UV_INHERIT_FD;
      errorData.Stdio.data.fd = error.FileDescriptor;
      break;
  }

  auto const& output =
    this->Builder->Stdio[cmUVProcessChainBuilder::Stream_OUTPUT];
  auto& outputData = this->OutputStreamData;
  switch (output.Type) {
    case cmUVProcessChainBuilder::None:
      outputData.Stdio.flags = UV_IGNORE;
      break;

    case cmUVProcessChainBuilder::Builtin:
      if (this->Builder->MergedBuiltinStreams) {
        outputData.BuiltinStream = errorData.BuiltinStream;
        outputData.Stdio.flags = UV_INHERIT_FD;
        outputData.Stdio.data.fd = errorData.Stdio.data.fd;
      } else {
        int pipeFd[2];
        if (cmGetPipes(pipeFd) < 0) {
          return false;
        }

        outputData.BuiltinStream = pipeFd[0];
        outputData.Stdio.flags = UV_INHERIT_FD;
        outputData.Stdio.data.fd = pipeFd[1];

        if (this->TempOutputPipe.init(*this->Loop, 0) < 0) {
          return false;
        }
        if (uv_pipe_open(this->TempOutputPipe, outputData.Stdio.data.fd) < 0) {
          return false;
        }
      }
      break;

    case cmUVProcessChainBuilder::External:
      outputData.Stdio.flags = UV_INHERIT_FD;
      outputData.Stdio.data.fd = output.FileDescriptor;
      break;
  }

  bool first = true;
  for (std::size_t i = 0; i < this->Builder->Processes.size(); i++) {
    this->Processes.emplace_back(cm::make_unique<ProcessData>());
    auto& process = *this->Processes.back();
    process.Data = this;
    process.ProcessStatus.Finished = false;

    if (!first) {
      auto& prevProcess = *this->Processes[i - 1];

      int pipeFd[2];
      if (cmGetPipes(pipeFd) < 0) {
        return false;
      }

      if (prevProcess.OutputPipe.init(*this->Loop, 0) < 0) {
        return false;
      }
      if (uv_pipe_open(prevProcess.OutputPipe, pipeFd[1]) < 0) {
        return false;
      }
      if (process.InputPipe.init(*this->Loop, 0) < 0) {
        return false;
      }
      if (uv_pipe_open(process.InputPipe, pipeFd[0]) < 0) {
        return false;
      }
    }

    first = false;
  }

  return true;
}